

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

int __thiscall
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,int>
          (VectorTryCastOperator<duckdb::NumericTryCast> *this,hugeint_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  ValidityMask *pVVar3;
  hugeint_t input_00;
  hugeint_t input_01;
  int output;
  int local_54;
  string local_50;
  
  input_00.upper = input.lower;
  input_00.lower = (uint64_t)this;
  pVVar3 = mask;
  bVar1 = Hugeint::TryCast<int>(input_00,&local_54);
  if (!bVar1) {
    input_01.upper = (int64_t)pVVar3;
    input_01.lower = input_00.upper;
    CastExceptionText<duckdb::hugeint_t,int>(&local_50,(duckdb *)this,input_01);
    iVar2 = HandleVectorCastError::Operation<int>
                      (&local_50,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_54 = iVar2;
  }
  return local_54;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}